

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_sendf(Curl_easy *data,connectdata *conn,char *fmt,...)

{
  uint uVar1;
  dynbuf *s;
  uint uVar2;
  char in_AL;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  pcVar5 = (conn->proto).imapc.resptag;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  iVar3 = curlx_sltosi(conn->connection_id % 0x1a);
  uVar2 = (conn->proto).imapc.cmdid;
  uVar1 = uVar2 + 1;
  (conn->proto).imapc.cmdid = uVar1;
  curl_msnprintf(pcVar5,5,"%c%03d",(ulong)(iVar3 + 0x41),(ulong)(uVar2 + (uVar1 / 1000) * -1000 + 1)
                );
  s = &(conn->proto).imapc.dyn;
  Curl_dyn_reset(s);
  CVar4 = Curl_dyn_addf(s,"%s %s",pcVar5,fmt);
  if (CVar4 == CURLE_OK) {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_f8.gp_offset = 0x18;
    local_f8.fp_offset = 0x30;
    pcVar5 = Curl_dyn_ptr(s);
    CVar4 = Curl_pp_vsendf(data,&(conn->proto).ftpc.pp,pcVar5,&local_f8);
  }
  return CVar4;
}

Assistant:

static CURLcode imap_sendf(struct Curl_easy *data,
                           struct connectdata *conn, const char *fmt, ...)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  DEBUGASSERT(fmt);

  /* Calculate the tag based on the connection ID and command ID */
  msnprintf(imapc->resptag, sizeof(imapc->resptag), "%c%03d",
            'A' + curlx_sltosi(conn->connection_id % 26),
            (++imapc->cmdid)%1000);

  /* start with a blank buffer */
  Curl_dyn_reset(&imapc->dyn);

  /* append tag + space + fmt */
  result = Curl_dyn_addf(&imapc->dyn, "%s %s", imapc->resptag, fmt);
  if(!result) {
    va_list ap;
    va_start(ap, fmt);
    result = Curl_pp_vsendf(data, &imapc->pp, Curl_dyn_ptr(&imapc->dyn), ap);
    va_end(ap);
  }
  return result;
}